

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O2

DifferenceReport *
flow::diagnostics::difference
          (DifferenceReport *__return_storage_ptr__,BufferedReport *first,BufferedReport *second)

{
  pointer pMVar1;
  bool bVar2;
  Message *m;
  pointer pMVar3;
  BufferedReport *__range2;
  
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (first->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (first->messages_).
                super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    bVar2 = BufferedReport::contains(second,pMVar3);
    if (!bVar2) {
      std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
      push_back(&__return_storage_ptr__->first,pMVar3);
    }
  }
  pMVar1 = (second->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (second->messages_).
                super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    bVar2 = BufferedReport::contains(first,pMVar3);
    if (!bVar2) {
      std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
      push_back(&__return_storage_ptr__->second,pMVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DifferenceReport difference(const BufferedReport& first, const BufferedReport& second) {
  DifferenceReport diff;

  for (const Message& m: first)
    if (!second.contains(m))
      diff.first.push_back(m);

  for (const Message& m: second)
    if (!first.contains(m))
      diff.second.push_back(m);

  return diff;
}